

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

FString V_GetColorStringByName(char *name)

{
  int iVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  LumpRecord *in_RSI;
  char *pcVar7;
  char *__s1;
  FMemLump rgbNames;
  FMemLump local_60;
  char *local_58;
  LumpRecord *local_50;
  int c [3];
  
  local_50 = in_RSI;
  FMemLump::FMemLump(&rgbNames);
  iVar3 = FWadCollection::GetNumLumps(&Wads);
  if (iVar3 != 0) {
    iVar3 = FWadCollection::CheckNumForName(&Wads,"X11R6RGB");
    if (iVar3 != -1) {
      FWadCollection::ReadLump((FWadCollection *)&local_60,0xa07390);
      FMemLump::operator=(&rgbNames,&local_60);
      FMemLump::~FMemLump(&local_60);
      iVar1 = *(int *)((long)rgbNames.Block.Chars + -0xc);
      iVar3 = FWadCollection::LumpLength(&Wads,iVar3);
      pcVar7 = (char *)0x0;
      if (iVar1 == 0) {
        rgbNames.Block.Chars = (FString)(FString)pcVar7;
      }
      pcVar6 = (char *)((long)rgbNames.Block.Chars + (long)iVar3);
      __n = strlen((char *)local_50);
LAB_005137bf:
      do {
        __s1 = (char *)rgbNames.Block.Chars;
        if (pcVar6 <= __s1) goto LAB_005138f9;
        if (*__s1 < '!') {
          do {
            __s1 = __s1 + 1;
            rgbNames.Block.Chars = (FString)(FString)__s1;
            if (pcVar6 <= __s1) break;
          } while (*__s1 < '!');
          goto LAB_005137bf;
        }
        iVar3 = (int)pcVar7;
        if ((iVar3 == 0) && (*__s1 == '!')) {
          do {
            __s1 = __s1 + 1;
            if (pcVar6 <= __s1) break;
          } while (*__s1 != '\n');
          pcVar7 = (char *)0x0;
          rgbNames.Block.Chars = (FString)(FString)__s1;
          goto LAB_005137bf;
        }
        if (iVar3 < 3) {
          uVar4 = strtoul(__s1,&local_58,10);
          c[iVar3] = (int)uVar4;
          if (local_58 == __s1) {
LAB_005138eb:
            pcVar7 = "X11R6RGB lump is corrupt\n";
            goto LAB_005138f2;
          }
          pcVar7 = (char *)(ulong)(iVar3 + 1);
          rgbNames.Block.Chars = (FString)(FString)local_58;
          goto LAB_005137bf;
        }
        pcVar7 = __s1;
        lVar2 = 0;
        do {
          lVar5 = lVar2;
          local_58 = pcVar7;
          if (pcVar6 <= local_58) break;
          pcVar7 = local_58 + 1;
          lVar2 = lVar5 + 1;
        } while (*local_58 != '\n');
        for (; (__s1 < __s1 + lVar5 && (__s1[lVar5] < '!')); lVar5 = lVar5 + -1) {
        }
        if (lVar5 == 0) goto LAB_005138eb;
        local_58 = __s1 + lVar5 + 1;
        pcVar7 = (char *)0x0;
        rgbNames.Block.Chars = (FString)(FString)local_58;
        if (__n - 1 != lVar5) goto LAB_005137bf;
        iVar3 = strncasecmp(__s1,(char *)local_50,__n);
        pcVar7 = (char *)0x0;
      } while (iVar3 != 0);
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      name[0] = -0x44;
      name[1] = -0xf;
      name[2] = '\x7f';
      name[3] = '\0';
      name[4] = '\0';
      name[5] = '\0';
      name[6] = '\0';
      name[7] = '\0';
      FString::Format((FString *)name,"#%02x%02x%02x",(ulong)(uint)c[0],(ulong)(uint)c[1],
                      (ulong)(uint)c[2]);
      goto LAB_0051390a;
    }
    pcVar7 = "X11R6RGB lump not found\n";
LAB_005138f2:
    Printf(pcVar7);
  }
LAB_005138f9:
  name[0] = -0x44;
  name[1] = -0xf;
  name[2] = '\x7f';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
LAB_0051390a:
  FMemLump::~FMemLump(&rgbNames);
  return (FString)name;
}

Assistant:

FString V_GetColorStringByName (const char *name)
{
	FMemLump rgbNames;
	char *rgbEnd;
	char *rgb, *endp;
	int rgblump;
	int c[3], step;
	size_t namelen;

	if (Wads.GetNumLumps()==0) return FString();

	rgblump = Wads.CheckNumForName ("X11R6RGB");
	if (rgblump == -1)
	{
		Printf ("X11R6RGB lump not found\n");
		return FString();
	}

	rgbNames = Wads.ReadLump (rgblump);
	rgb = (char *)rgbNames.GetMem();
	rgbEnd = rgb + Wads.LumpLength (rgblump);
	step = 0;
	namelen = strlen (name);

	while (rgb < rgbEnd)
	{
		// Skip white space
		if (*rgb <= ' ')
		{
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb <= ' ');
		}
		else if (step == 0 && *rgb == '!')
		{ // skip comment lines
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb != '\n');
		}
		else if (step < 3)
		{ // collect RGB values
			c[step++] = strtoul (rgb, &endp, 10);
			if (endp == rgb)
			{
				break;
			}
			rgb = endp;
		}
		else
		{ // Check color name
			endp = rgb;
			// Find the end of the line
			while (endp < rgbEnd && *endp != '\n')
				endp++;
			// Back up over any whitespace
			while (endp > rgb && *endp <= ' ')
				endp--;
			if (endp == rgb)
			{
				break;
			}
			size_t checklen = ++endp - rgb;
			if (checklen == namelen && strnicmp (rgb, name, checklen) == 0)
			{
				FString descr;
				descr.Format ("#%02x%02x%02x", c[0], c[1], c[2]);
				return descr;
			}
			rgb = endp;
			step = 0;
		}
	}
	if (rgb < rgbEnd)
	{
		Printf ("X11R6RGB lump is corrupt\n");
	}
	return FString();
}